

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O0

bool __thiscall FIX::SocketConnection::processQueue(SocketConnection *this)

{
  socket_handle s;
  long lVar1;
  int iVar2;
  size_type sVar3;
  long lVar4;
  long lVar5;
  ssize_t sVar6;
  ssize_t result;
  string *msg;
  pollfd local_2c;
  pollfd pfd;
  Locker l;
  SocketConnection *this_local;
  
  Locker::Locker((Locker *)&pfd.events,&this->m_mutex);
  sVar3 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_sendQueue);
  if (sVar3 == 0) {
    this_local._7_1_ = true;
  }
  else {
    local_2c.fd = this->m_socket;
    local_2c.events = 4;
    local_2c.revents = 0;
    iVar2 = poll(&local_2c,1,0);
    if (iVar2 < 1) {
      this_local._7_1_ = false;
    }
    else {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::front(&this->m_sendQueue);
      s = this->m_socket;
      lVar4 = std::__cxx11::string::c_str();
      lVar1 = this->m_sendLength;
      lVar5 = std::__cxx11::string::length();
      sVar6 = socket_send(s,(char *)(lVar4 + lVar1),lVar5 - this->m_sendLength);
      if (0 < sVar6) {
        this->m_sendLength = sVar6 + this->m_sendLength;
      }
      lVar1 = this->m_sendLength;
      lVar4 = std::__cxx11::string::length();
      if (lVar1 == lVar4) {
        this->m_sendLength = 0;
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_front(&this->m_sendQueue);
      }
      sVar3 = std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->m_sendQueue);
      this_local._7_1_ = (bool)((sVar3 != 0 ^ 0xffU) & 1);
    }
  }
  pfd.fd = 1;
  Locker::~Locker((Locker *)&pfd.events);
  return this_local._7_1_;
}

Assistant:

bool SocketConnection::processQueue() {
  Locker l(m_mutex);

  if (!m_sendQueue.size()) {
    return true;
  }

#ifdef _MSC_VER
  struct timeval timeout = {0, 0};
  fd_set writeset = m_fds;
  if (select(0, 0, &writeset, 0, &timeout) <= 0) {
    return false;
  }
#else
  struct pollfd pfd = {m_socket, POLLOUT, 0};
  if (poll(&pfd, 1, 0) <= 0) {
    return false;
  }
#endif

  const std::string &msg = m_sendQueue.front();

  ssize_t result = socket_send(m_socket, msg.c_str() + m_sendLength, msg.length() - m_sendLength);

  if (result > 0) {
    m_sendLength += result;
  }

  if (m_sendLength == msg.length()) {
    m_sendLength = 0;
    m_sendQueue.pop_front();
  }

  return !m_sendQueue.size();
}